

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O1

char * getVarName(char *suffixFormula,int startLoc,int *endLocation)

{
  char *__dest;
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  
  if (((ulong)(byte)suffixFormula[startLoc] < 0x3b) &&
     ((0x400000100000601U >> ((ulong)(byte)suffixFormula[startLoc] & 0x3f) & 1) != 0)) {
    __dest = (char *)0x0;
  }
  else {
    uVar3 = 0;
    while ((uVar1 = (ulong)(byte)(suffixFormula + startLoc)[uVar3], 0x3a < uVar1 ||
           ((0x400000100000601U >> (uVar1 & 0x3f) & 1) == 0))) {
      uVar3 = uVar3 + 1;
    }
    iVar2 = (int)uVar3;
    *endLocation = startLoc + iVar2;
    __dest = (char *)malloc((long)(iVar2 + 1));
    if (iVar2 < 1) {
      uVar3 = 0;
    }
    else {
      memcpy(__dest,suffixFormula + startLoc,uVar3);
      uVar3 = uVar3 & 0xffffffff;
    }
    __dest[uVar3] = '\0';
  }
  return __dest;
}

Assistant:

char *getVarName( char *suffixFormula, int startLoc, int *endLocation )
{
	int i = startLoc, length;
	char *name;

	if( isNotVarNameSymbol( suffixFormula[startLoc] ) )
		return NULL;

	while( !isNotVarNameSymbol( suffixFormula[i] ) )
		i++;
	*endLocation = i;
	length = i - startLoc;
	name = (char *)malloc( sizeof(char) * (length + 1));
	for( i=0; i<length; i++ )
		name[i] = suffixFormula[i+startLoc];
	name[i] = '\0';

	return name;
}